

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

RegularExpression * __thiscall
cmsys::RegularExpression::operator=(RegularExpression *this,RegularExpression *rxp)

{
  char *pcVar1;
  ulong uVar2;
  
  if (this != rxp) {
    if (rxp->program == (char *)0x0) {
      this->program = (char *)0x0;
    }
    else {
      this->progsize = rxp->progsize;
      if (this->program != (char *)0x0) {
        operator_delete__(this->program);
      }
      uVar2 = (ulong)this->progsize;
      pcVar1 = (char *)operator_new__(uVar2);
      this->program = pcVar1;
      for (; uVar2 != 0; uVar2 = uVar2 - 1) {
        this->program[uVar2 - 1] = rxp->program[uVar2 - 1];
      }
      memcpy(this,rxp,0x208);
      this->regmust = rxp->regmust;
      pcVar1 = rxp->regmust;
      if (pcVar1 != (char *)0x0) {
        uVar2 = 0;
        if (rxp->program != pcVar1) {
          uVar2 = (ulong)(uint)((int)pcVar1 - (int)rxp->program);
        }
        this->regmust = this->program + uVar2;
      }
      this->regstart = rxp->regstart;
      this->reganch = rxp->reganch;
      this->regmlen = rxp->regmlen;
    }
  }
  return this;
}

Assistant:

RegularExpression& RegularExpression::operator=(const RegularExpression& rxp)
{
  if (this == &rxp) {
    return *this;
  }
  if (!rxp.program) {
    this->program = nullptr;
    return *this;
  }
  int ind;
  this->progsize = rxp.progsize; // Copy regular expression size
  delete[] this->program;
  this->program = new char[this->progsize]; // Allocate storage
  for (ind = this->progsize; ind-- != 0;)   // Copy regular expression
    this->program[ind] = rxp.program[ind];
  // Copy pointers into last successful "find" operation
  this->regmatch = rxp.regmatch;
  this->regmust = rxp.regmust; // Copy field
  if (rxp.regmust != nullptr) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart; // Copy starting index
  this->reganch = rxp.reganch;   // Copy remaining private data
  this->regmlen = rxp.regmlen;   // Copy remaining private data

  return *this;
}